

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_capi_appender.cpp
# Opt level: O1

void AssertDecimalValueMatches
               (unique_ptr<duckdb::CAPIResult,_std::default_delete<duckdb::CAPIResult>,_true>
                *result,duckdb_decimal expected)

{
  uint8_t uVar1;
  uint64_t uVar2;
  int64_t iVar3;
  pointer this;
  SourceLineInfo local_110;
  AssertionHandler local_100;
  ITransientExpression local_b8;
  duckdb_decimal *local_a8;
  char *local_a0;
  size_t sStack_98;
  duckdb_decimal *local_90;
  duckdb_decimal local_88;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  this = duckdb::unique_ptr<duckdb::CAPIResult,_std::default_delete<duckdb::CAPIResult>,_true>::
         operator->(result);
  duckdb::CAPIResult::Fetch<duckdb_decimal>(&local_88,this,0,0);
  local_b8._vptr_ITransientExpression = (_func_int **)0x4b9018;
  local_b8.m_isBinaryExpression = true;
  local_b8.m_result = false;
  local_b8._10_6_ = 0;
  local_110.file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/api/capi/test_capi_appender.cpp"
  ;
  local_110.line = 0x2b;
  Catch::StringRef::StringRef(&local_40,"actual.scale == expected.scale");
  Catch::AssertionHandler::AssertionHandler
            (&local_100,(StringRef *)&local_b8,&local_110,local_40,Normal);
  uVar1 = expected.scale;
  Catch::StringRef::StringRef((StringRef *)&local_110,"==");
  local_b8.m_result = local_88.scale == uVar1;
  local_b8.m_isBinaryExpression = true;
  local_a8 = (duckdb_decimal *)&local_88.scale;
  local_b8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_005d9a40;
  local_a0 = local_110.file;
  sStack_98 = local_110.line;
  local_90 = (duckdb_decimal *)&expected.scale;
  Catch::AssertionHandler::handleExpr(&local_100,&local_b8);
  Catch::ITransientExpression::~ITransientExpression(&local_b8);
  Catch::AssertionHandler::complete(&local_100);
  if (local_100.m_completed == false) {
    (*(local_100.m_resultCapture)->_vptr_IResultCapture[0x11])();
  }
  local_b8._vptr_ITransientExpression = (_func_int **)0x4b9018;
  local_b8.m_isBinaryExpression = true;
  local_b8.m_result = false;
  local_b8._10_6_ = 0;
  local_110.file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/api/capi/test_capi_appender.cpp"
  ;
  local_110.line = 0x2c;
  Catch::StringRef::StringRef(&local_50,"actual.width == expected.width");
  Catch::AssertionHandler::AssertionHandler
            (&local_100,(StringRef *)&local_b8,&local_110,local_50,Normal);
  uVar1 = expected.width;
  Catch::StringRef::StringRef((StringRef *)&local_110,"==");
  local_b8.m_result = local_88.width == uVar1;
  local_b8.m_isBinaryExpression = true;
  local_b8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_005d9a40;
  local_a8 = &local_88;
  local_a0 = local_110.file;
  sStack_98 = local_110.line;
  local_90 = &expected;
  Catch::AssertionHandler::handleExpr(&local_100,&local_b8);
  Catch::ITransientExpression::~ITransientExpression(&local_b8);
  Catch::AssertionHandler::complete(&local_100);
  if (local_100.m_completed == false) {
    (*(local_100.m_resultCapture)->_vptr_IResultCapture[0x11])();
  }
  local_b8._vptr_ITransientExpression = (_func_int **)0x4b9018;
  local_b8.m_isBinaryExpression = true;
  local_b8.m_result = false;
  local_b8._10_6_ = 0;
  local_110.file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/api/capi/test_capi_appender.cpp"
  ;
  local_110.line = 0x2d;
  Catch::StringRef::StringRef(&local_60,"actual.value.lower == expected.value.lower");
  Catch::AssertionHandler::AssertionHandler
            (&local_100,(StringRef *)&local_b8,&local_110,local_60,Normal);
  uVar2 = expected.value.lower;
  Catch::StringRef::StringRef((StringRef *)&local_110,"==");
  local_b8.m_result = local_88.value.lower == uVar2;
  local_b8.m_isBinaryExpression = true;
  local_90 = (duckdb_decimal *)&expected.value;
  local_b8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_005d9480;
  local_a0 = local_110.file;
  sStack_98 = local_110.line;
  local_a8 = (duckdb_decimal *)&local_88.value;
  Catch::AssertionHandler::handleExpr(&local_100,&local_b8);
  Catch::ITransientExpression::~ITransientExpression(&local_b8);
  Catch::AssertionHandler::complete(&local_100);
  if (local_100.m_completed == false) {
    (*(local_100.m_resultCapture)->_vptr_IResultCapture[0x11])();
  }
  local_b8._vptr_ITransientExpression = (_func_int **)0x4b9018;
  local_b8.m_isBinaryExpression = true;
  local_b8.m_result = false;
  local_b8._10_6_ = 0;
  local_110.file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/api/capi/test_capi_appender.cpp"
  ;
  local_110.line = 0x2e;
  Catch::StringRef::StringRef(&local_70,"actual.value.upper == expected.value.upper");
  Catch::AssertionHandler::AssertionHandler
            (&local_100,(StringRef *)&local_b8,&local_110,local_70,Normal);
  iVar3 = expected.value.upper;
  Catch::StringRef::StringRef((StringRef *)&local_110,"==");
  local_b8.m_result = local_88.value.upper == iVar3;
  local_b8.m_isBinaryExpression = true;
  local_90 = (duckdb_decimal *)&expected.value.upper;
  local_b8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_005d99c0;
  local_a0 = local_110.file;
  sStack_98 = local_110.line;
  local_a8 = (duckdb_decimal *)&local_88.value.upper;
  Catch::AssertionHandler::handleExpr(&local_100,&local_b8);
  Catch::ITransientExpression::~ITransientExpression(&local_b8);
  Catch::AssertionHandler::complete(&local_100);
  if (local_100.m_completed == false) {
    (*(local_100.m_resultCapture)->_vptr_IResultCapture[0x11])();
  }
  return;
}

Assistant:

void AssertDecimalValueMatches(duckdb::unique_ptr<CAPIResult> &result, duckdb_decimal expected) {
	duckdb_decimal actual;

	actual = result->Fetch<duckdb_decimal>(0, 0);
	REQUIRE(actual.scale == expected.scale);
	REQUIRE(actual.width == expected.width);
	REQUIRE(actual.value.lower == expected.value.lower);
	REQUIRE(actual.value.upper == expected.value.upper);
}